

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O3

void dfs(int u)

{
  ulong *puVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  int in_EDI;
  int local_24;
  
  uVar6 = (ulong)in_EDI;
  iVar3 = in_EDI + 0x3f;
  if (-1 < in_EDI) {
    iVar3 = in_EDI;
  }
  puVar1 = (ulong *)((long)(iVar3 >> 6) * 8 + (anonymous_namespace)::useddfs + -8 +
                    (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) * 8);
  *puVar1 = *puVar1 | 1L << ((byte)in_EDI & 0x3f);
  if (DAT_001193c0._M_current == DAT_001193c8) {
    local_24 = in_EDI;
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::comp,DAT_001193c0,
               &local_24);
    uVar6 = (ulong)local_24;
  }
  else {
    *DAT_001193c0._M_current = in_EDI;
    DAT_001193c0._M_current = DAT_001193c0._M_current + 1;
  }
  piVar2 = edge.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar6].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (anonymous_namespace)::useddfs;
  for (piVar7 = edge.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar6].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar7 != piVar2; piVar7 = piVar7 + 1) {
    iVar3 = *piVar7;
    uVar6 = (ulong)iVar3;
    iVar5 = iVar3 + 0x3f;
    if (-1 < (long)uVar6) {
      iVar5 = iVar3;
    }
    if ((*(ulong *)(lVar4 + (long)(iVar5 >> 6) * 8 + -8 +
                   (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) * 8) >> (uVar6 & 0x3f)
        & 1) == 0) {
      dfs(0);
      lVar4 = (anonymous_namespace)::useddfs;
    }
  }
  return;
}

Assistant:

void dfs(int u) {
    useddfs[u] = true;
    comp.push_back(u);
    for (int i : edge[u])
        if (!useddfs[i])
            dfs(i);
}